

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

void __thiscall asl::PacketSocket_::~PacketSocket_(PacketSocket_ *this)

{
  Socket_::~Socket_(&this->super_Socket_);
  operator_delete(this);
  return;
}

Assistant:

ASL_SMART_CLASS(PacketSocket, Socket)
{
	ASL_SMART_INNER_DEF(PacketSocket);
	PacketSocket_();
	PacketSocket_(int fd);
	String readLine();
	void sendTo(const InetAddress& addr, const void* data, int n);
	int readFrom(InetAddress& addr, void* data, int n);
}